

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O1

bool __thiscall cppnet::RWSocket::Send(RWSocket *this)

{
  element_type *peVar1;
  element_type *peVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  SysCallInt32Result SVar6;
  int *piVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint32_t len;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  byte bVar8;
  bool bVar9;
  vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> io_vec;
  Iovec *local_68;
  long lStack_60;
  undefined8 local_58;
  element_type *local_48;
  shared_ptr<cppnet::RWSocket> local_40;
  
  this_00 = (this->super_Socket)._cppnet_base.
            super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar5 = this_00->_M_use_count;
    do {
      if (iVar5 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar4 = this_00->_M_use_count;
      bVar9 = iVar5 == iVar4;
      if (bVar9) {
        this_00->_M_use_count = iVar5 + 1;
        iVar4 = iVar5;
      }
      iVar5 = iVar4;
      UNLOCK();
    } while (!bVar9);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar9 = true;
  }
  else {
    bVar9 = this_00->_M_use_count == 0;
  }
  local_48 = (this->super_Socket)._cppnet_base.
             super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  len = 0;
  iVar5 = 0;
  bVar8 = 0;
  if (local_48 != (element_type *)0x0 && !bVar9) {
    do {
      peVar1 = (this->_write_buffer).
               super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar1 == (element_type *)0x0) ||
         (iVar4 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[8])(), iVar4 == 0)) {
        std::__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<cppnet::RWSocket,void>
                  ((__shared_ptr<cppnet::RWSocket,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                   (__weak_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<cppnet::RWSocket>);
        CppNetBase::OnWrite(local_48,&local_40,len);
        bVar8 = 1;
        if (local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        break;
      }
      local_68 = (Iovec *)0x0;
      lStack_60 = 0;
      local_58 = 0;
      peVar1 = (this->_write_buffer).
               super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[0x11])(peVar1,&local_68,0x1000);
      SVar6 = OsHandle::Writev((this->super_Socket)._sock,local_68,
                               (uint32_t)((ulong)(lStack_60 - (long)local_68) >> 4));
      if ((ulong)SVar6 < 0x80000000) {
        peVar1 = (this->_write_buffer).
                 super___shared_ptr<cppnet::BufferQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[6])
                  (peVar1,(ulong)SVar6 & 0xffffffff);
        len = len + SVar6._return_value;
      }
      else {
        piVar7 = __errno_location();
        iVar5 = *piVar7;
        if (iVar5 == 4) {
LAB_0010dc2e:
          this_01 = (this->super_Socket)._event_actions.
                    super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            iVar5 = this_01->_M_use_count;
            do {
              if (iVar5 == 0) {
                this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                break;
              }
              LOCK();
              iVar4 = this_01->_M_use_count;
              bVar9 = iVar5 == iVar4;
              if (bVar9) {
                this_01->_M_use_count = iVar5 + 1;
                iVar4 = iVar5;
              }
              iVar5 = iVar4;
              UNLOCK();
            } while (!bVar9);
          }
          if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            bVar9 = true;
          }
          else {
            bVar9 = this_01->_M_use_count == 0;
          }
          peVar2 = (this->super_Socket)._event_actions.
                   super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 == (element_type *)0x0 || bVar9) {
            iVar5 = 0;
          }
          else {
            iVar5 = (*peVar2->_vptr_EventActions[4])(peVar2,this->_event);
          }
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
        }
        else {
          if (iVar5 == 0x4a) {
            uVar3 = 2;
          }
          else {
            if (iVar5 == 0xb) goto LAB_0010dc2e;
            uVar3 = 1;
          }
          (*(this->super_Socket)._vptr_Socket[0x11])(this,(ulong)uVar3);
          iVar5 = 0;
        }
      }
      bVar8 = (byte)iVar5;
      if (local_68 != (Iovec *)0x0) {
        operator_delete(local_68);
      }
    } while ((ulong)SVar6 >> 0x1f == 0);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool RWSocket::Send() {
    auto cppnet_base = _cppnet_base.lock();
    if (!cppnet_base) {
        return false;
    }

    uint32_t off_set = 0;
    while(_write_buffer && _write_buffer->GetCanReadLength() > 0) {
        std::vector<Iovec> io_vec;
        _write_buffer->GetUseMemoryBlock(io_vec, __linux_write_buff_get);
        auto ret = OsHandle::Writev(_sock, &*io_vec.begin(), io_vec.size());
        if (ret._return_value >= 0 && ret._errno == 0) {
            _write_buffer->MoveReadPt(ret._return_value);
            off_set += ret._return_value;

        } else {
            if (errno == EWOULDBLOCK || errno == EAGAIN || errno == EINTR) {
                //can't send complete
                auto actions = GetEventActions();
                if (actions) {
                    return actions->AddSendEvent(_event);
                }
                return false;

            } else if (errno == EBADMSG) {
                OnDisConnect(CEC_CONNECT_BREAK);
                return false;

            } else {
                OnDisConnect(CEC_CLOSED);
                return false;
            }
        }
    }
    cppnet_base->OnWrite(shared_from_this(), off_set);
    return true;
}